

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O3

LY_ERR yin_parse_yin_element
                 (lysp_yin_ctx *ctx,void *parent,uint16_t *flags,lysp_ext_instance **exts)

{
  char *__s1;
  ushort uVar1;
  LY_ERR LVar2;
  int iVar3;
  char *temp_val;
  yin_subelement subelems [1];
  
  temp_val = (char *)0x0;
  subelems[0].flags = 0;
  subelems[0]._18_6_ = 0;
  subelems[0].type = LY_STMT_EXTENSION_INSTANCE;
  subelems[0]._4_4_ = 0;
  subelems[0].dest = (void *)0x0;
  LVar2 = lyxml_ctx_next(ctx->xmlctx);
  if ((LVar2 == LY_SUCCESS) &&
     (LVar2 = yin_parse_attribute(ctx,YIN_ARG_VALUE,&temp_val,Y_STR_ARG,LY_STMT_YIN_ELEMENT),
     __s1 = temp_val, LVar2 == LY_SUCCESS)) {
    iVar3 = strcmp(temp_val,"true");
    if (iVar3 == 0) {
      uVar1 = 0x80;
    }
    else {
      iVar3 = strcmp(__s1,"false");
      if (iVar3 != 0) {
        ly_vlog((ly_ctx *)
                **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1],
                (char *)0x0,LYVE_SYNTAX_YIN,
                "Invalid value \"%s\" of \"%s\" attribute in \"%s\" element. Valid values are \"%s\" and \"%s\"."
                ,__s1,"value","yin-element","true","false");
        lydict_remove(ctx->xmlctx->ctx,temp_val);
        return LY_EVALID;
      }
      uVar1 = 0x100;
    }
    *flags = *flags | uVar1;
    lydict_remove(ctx->xmlctx->ctx,__s1);
    LVar2 = yin_parse_content(ctx,subelems,1,parent,LY_STMT_YIN_ELEMENT,(char **)0x0,exts);
  }
  return LVar2;
}

Assistant:

static LY_ERR
yin_parse_yin_element(struct lysp_yin_ctx *ctx, const void *parent, uint16_t *flags, struct lysp_ext_instance **exts)
{
    const char *temp_val = NULL;
    struct yin_subelement subelems[] = {
        {LY_STMT_EXTENSION_INSTANCE, NULL, 0}
    };

    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_VALUE, &temp_val, Y_STR_ARG, LY_STMT_YIN_ELEMENT));
    if (strcmp(temp_val, "true") == 0) {
        *flags |= LYS_YINELEM_TRUE;
    } else if (strcmp(temp_val, "false") == 0) {
        *flags |= LYS_YINELEM_FALSE;
    } else {
        LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_INVAL_YIN VALID_VALS2, temp_val, "value",
                "yin-element", "true", "false");
        lydict_remove(ctx->xmlctx->ctx, temp_val);
        return LY_EVALID;
    }
    lydict_remove(ctx->xmlctx->ctx, temp_val);

    LY_CHECK_RET(yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), parent, LY_STMT_YIN_ELEMENT, NULL, exts));

    return LY_SUCCESS;
}